

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void stmt(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  Token *pTVar3;
  Scanner *pSVar4;
  uint32_t *puVar5;
  TokenType TVar6;
  uint64_t uVar7;
  CallFrame *pCVar8;
  uint64_t uVar9;
  uint64_t address;
  uint64_t address_00;
  uint64_t uVar10;
  size_t sVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  CallFrame **ppCVar16;
  ulong uVar17;
  char *pcVar18;
  Token local_50;
  
  pCVar1 = &vm->compiler;
  TVar6 = (vm->compiler).token.type;
  if ((int)TVar6 < 0x21) {
    if (TVar6 == TOKEN_WHILE) {
      (vm->compiler).print_expr = false;
      TVar6 = (pCVar1->token).type;
      uVar14 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar18 = (vm->compiler).token.start;
      uVar12 = (vm->compiler).token.line;
      uVar13 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      (vm->compiler).previous.length = (vm->compiler).token.length;
      (vm->compiler).previous.line = uVar12;
      *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar13;
      (vm->compiler).previous.type = TVar6;
      *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar14;
      (vm->compiler).previous.start = pcVar18;
      uVar13 = *(undefined4 *)&(vm->compiler).next.field_0x4;
      pcVar18 = (vm->compiler).next.start;
      sVar11 = (vm->compiler).next.length;
      uVar12 = (vm->compiler).next.line;
      uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = (vm->compiler).next.type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar13;
      (vm->compiler).token.start = pcVar18;
      (vm->compiler).token.length = sVar11;
      (vm->compiler).token.line = uVar12;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
      scan_token(&local_50,&(vm->compiler).scanner);
      (vm->compiler).next.length = local_50.length;
      (vm->compiler).next.line = local_50.line;
      *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
      (vm->compiler).next.type = local_50.type;
      *(undefined4 *)&(vm->compiler).next.field_0x4 = local_50._4_4_;
      (vm->compiler).next.start = local_50.start;
      uVar7 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
      expr(vm);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,')');
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      uVar9 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
      loop_body(vm);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'&');
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      patch_jump_to(vm,((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count - 2,
                    uVar7);
      patch_jump_to(vm,uVar9 - 2,
                    ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count);
    }
    else {
      if (TVar6 != TOKEN_FOR) {
LAB_0010492c:
        simple_stmt(vm);
        return;
      }
      (vm->compiler).print_expr = false;
      pTVar2 = &(vm->compiler).previous;
      TVar6 = (pCVar1->token).type;
      uVar14 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar18 = (vm->compiler).token.start;
      uVar12 = (vm->compiler).token.line;
      uVar13 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      (vm->compiler).previous.length = (vm->compiler).token.length;
      (vm->compiler).previous.line = uVar12;
      *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar13;
      (vm->compiler).previous.type = TVar6;
      *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar14;
      (vm->compiler).previous.start = pcVar18;
      pTVar3 = &(vm->compiler).next;
      uVar13 = *(undefined4 *)&(vm->compiler).next.field_0x4;
      pcVar18 = (vm->compiler).next.start;
      sVar11 = (vm->compiler).next.length;
      uVar12 = (vm->compiler).next.line;
      uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = (vm->compiler).next.type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar13;
      (vm->compiler).token.start = pcVar18;
      (vm->compiler).token.length = sVar11;
      (vm->compiler).token.line = uVar12;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
      pSVar4 = &(vm->compiler).scanner;
      scan_token(&local_50,pSVar4);
      (vm->compiler).next.length = local_50.length;
      (vm->compiler).next.line = local_50.line;
      *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
      (vm->compiler).next.type = local_50.type;
      *(undefined4 *)&(vm->compiler).next.field_0x4 = local_50._4_4_;
      (vm->compiler).next.start = local_50.start;
      uVar15 = (vm->compiler).scope_depth + 1;
      (vm->compiler).scope_depth = uVar15;
      var_ht_init((vm->compiler).scope + uVar15,8);
      if ((vm->compiler).token.type == TOKEN_SEMICOLON) {
        TVar6 = (pCVar1->token).type;
        uVar14 = *(undefined4 *)&(pCVar1->token).field_0x4;
        pcVar18 = (vm->compiler).token.start;
        uVar12 = (vm->compiler).token.line;
        uVar13 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
        (vm->compiler).previous.length = (vm->compiler).token.length;
        (vm->compiler).previous.line = uVar12;
        *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar13;
        pTVar2->type = TVar6;
        *(undefined4 *)&pTVar2->field_0x4 = uVar14;
        (vm->compiler).previous.start = pcVar18;
        uVar13 = *(undefined4 *)&pTVar3->field_0x4;
        pcVar18 = (vm->compiler).next.start;
        sVar11 = (vm->compiler).next.length;
        uVar12 = (vm->compiler).next.line;
        uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        (pCVar1->token).type = pTVar3->type;
        *(undefined4 *)&(pCVar1->token).field_0x4 = uVar13;
        (vm->compiler).token.start = pcVar18;
        (vm->compiler).token.length = sVar11;
        (vm->compiler).token.line = uVar12;
        *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
        scan_token(&local_50,pSVar4);
        (vm->compiler).next.length = local_50.length;
        (vm->compiler).next.line = local_50.line;
        *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
        pTVar3->type = local_50.type;
        *(undefined4 *)&pTVar3->field_0x4 = local_50._4_4_;
        (vm->compiler).next.start = local_50.start;
      }
      else {
        simple_stmt(vm);
        TVar6 = (vm->compiler).previous.type;
        if (TVar6 != TOKEN_SEMICOLON) {
          uVar17 = (ulong)(vm->compiler).scope[(ulong)(TVar6 != TOKEN_ERROR) * 2 + -8].cap;
          pcVar18 = "Expected \';\' after for-initializer";
          goto LAB_00105037;
        }
      }
      uVar7 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
      if ((vm->compiler).token.type == TOKEN_SEMICOLON) {
        TVar6 = (pCVar1->token).type;
        uVar14 = *(undefined4 *)&(pCVar1->token).field_0x4;
        pcVar18 = (vm->compiler).token.start;
        uVar12 = (vm->compiler).token.line;
        uVar13 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
        (vm->compiler).previous.length = (vm->compiler).token.length;
        (vm->compiler).previous.line = uVar12;
        *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar13;
        pTVar2->type = TVar6;
        *(undefined4 *)&pTVar2->field_0x4 = uVar14;
        (vm->compiler).previous.start = pcVar18;
        uVar13 = *(undefined4 *)&pTVar3->field_0x4;
        pcVar18 = (vm->compiler).next.start;
        sVar11 = (vm->compiler).next.length;
        uVar12 = (vm->compiler).next.line;
        uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        (pCVar1->token).type = pTVar3->type;
        *(undefined4 *)&(pCVar1->token).field_0x4 = uVar13;
        (vm->compiler).token.start = pcVar18;
        (vm->compiler).token.length = sVar11;
        (vm->compiler).token.line = uVar12;
        *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
        scan_token(&local_50,pSVar4);
        (vm->compiler).next.length = local_50.length;
        (vm->compiler).next.line = local_50.line;
        *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
        pTVar3->type = local_50.type;
        *(undefined4 *)&pTVar3->field_0x4 = local_50._4_4_;
        (vm->compiler).next.start = local_50.start;
      }
      else {
        expr(vm);
        consume(&local_50,vm,TOKEN_SEMICOLON,"Expected \';\' after for-condition");
      }
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,')');
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      pCVar8 = (vm->frames).frame_pointers[vm->frame_count - 1];
      uVar9 = (pCVar8->code_buffer).count;
      write_code_buffer(&pCVar8->code_buffer,'&');
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      ppCVar16 = (vm->frames).frame_pointers;
      uVar17 = (ulong)(vm->frame_count - 1);
      address = (ppCVar16[uVar17]->code_buffer).count;
      if ((vm->compiler).token.type != TOKEN_OPEN_BRACE) {
        assignment(vm);
        write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x1b');
        ppCVar16 = (vm->frames).frame_pointers;
        uVar17 = (ulong)(vm->frame_count - 1);
      }
      write_code_buffer(&ppCVar16[uVar17]->code_buffer,'&');
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      if ((vm->compiler).token.type != TOKEN_OPEN_BRACE) {
        uVar17 = (ulong)(vm->compiler).scope[(ulong)(pTVar2->type != TOKEN_ERROR) * 2 + -8].cap;
        pcVar18 = "Expected \'{\' after assignment block in \'for\'";
        goto LAB_00105037;
      }
      address_00 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
      patch_jump_to(vm,address - 2,address_00);
      loop_body(vm);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'&');
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,0xff);
      uVar10 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count;
      patch_jump_to(vm,address_00 - 2,uVar7);
      patch_jump_to(vm,uVar9 - 2,
                    ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).count);
      patch_jump_to(vm,uVar10 - 2,address);
      uVar15 = (vm->compiler).scope_depth;
      puVar5 = &(vm->compiler).vars_in_scope;
      *puVar5 = *puVar5 - (vm->compiler).scope[uVar15].size;
      var_ht_free((vm->compiler).scope + uVar15);
      puVar5 = &(vm->compiler).scope_depth;
      *puVar5 = *puVar5 - 1;
    }
  }
  else if (TVar6 == TOKEN_RETURN) {
    if (vm->frame_count < 2) {
      uVar17 = (ulong)(vm->compiler).scope
                      [(ulong)((vm->compiler).previous.type != TOKEN_ERROR) * 2 + -8].cap;
      pcVar18 = "Cannot return from global scope";
LAB_00105037:
      printf("[Line %d] %s\n",uVar17,pcVar18);
      longjmp((__jmp_buf_tag *)error_buf,2);
    }
    (vm->compiler).print_expr = false;
    pTVar2 = &(vm->compiler).previous;
    TVar6 = (pCVar1->token).type;
    uVar14 = *(undefined4 *)&(pCVar1->token).field_0x4;
    pcVar18 = (vm->compiler).token.start;
    uVar12 = (vm->compiler).token.line;
    uVar13 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
    (vm->compiler).previous.length = (vm->compiler).token.length;
    (vm->compiler).previous.line = uVar12;
    *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar13;
    (vm->compiler).previous.type = TVar6;
    *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar14;
    (vm->compiler).previous.start = pcVar18;
    pTVar3 = &(vm->compiler).next;
    uVar13 = *(undefined4 *)&(vm->compiler).next.field_0x4;
    pcVar18 = (vm->compiler).next.start;
    sVar11 = (vm->compiler).next.length;
    uVar12 = (vm->compiler).next.line;
    uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
    (pCVar1->token).type = (vm->compiler).next.type;
    *(undefined4 *)&(pCVar1->token).field_0x4 = uVar13;
    (vm->compiler).token.start = pcVar18;
    (vm->compiler).token.length = sVar11;
    (vm->compiler).token.line = uVar12;
    *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
    pSVar4 = &(vm->compiler).scanner;
    scan_token(&local_50,pSVar4);
    (vm->compiler).next.length = local_50.length;
    (vm->compiler).next.line = local_50.line;
    *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
    (vm->compiler).next.type = local_50.type;
    *(undefined4 *)&(vm->compiler).next.field_0x4 = local_50._4_4_;
    (vm->compiler).next.start = local_50.start;
    if ((vm->compiler).token.type == TOKEN_SEMICOLON) {
      TVar6 = (pCVar1->token).type;
      uVar14 = *(undefined4 *)&(pCVar1->token).field_0x4;
      pcVar18 = (vm->compiler).token.start;
      uVar12 = (vm->compiler).token.line;
      uVar13 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
      (vm->compiler).previous.length = (vm->compiler).token.length;
      (vm->compiler).previous.line = uVar12;
      *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar13;
      pTVar2->type = TVar6;
      *(undefined4 *)&pTVar2->field_0x4 = uVar14;
      (vm->compiler).previous.start = pcVar18;
      uVar13 = *(undefined4 *)&pTVar3->field_0x4;
      pcVar18 = (vm->compiler).next.start;
      sVar11 = (vm->compiler).next.length;
      uVar12 = (vm->compiler).next.line;
      uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
      (pCVar1->token).type = pTVar3->type;
      *(undefined4 *)&(pCVar1->token).field_0x4 = uVar13;
      (vm->compiler).token.start = pcVar18;
      (vm->compiler).token.length = sVar11;
      (vm->compiler).token.line = uVar12;
      *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
      scan_token(&local_50,pSVar4);
      (vm->compiler).next.length = local_50.length;
      (vm->compiler).next.line = local_50.line;
      *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
      pTVar3->type = local_50.type;
      *(undefined4 *)&pTVar3->field_0x4 = local_50._4_4_;
      (vm->compiler).next.start = local_50.start;
      write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'\x03');
    }
    else {
      expr(vm);
      if ((vm->compiler).token.type == TOKEN_SEMICOLON) {
        TVar6 = (pCVar1->token).type;
        uVar14 = *(undefined4 *)&(pCVar1->token).field_0x4;
        pcVar18 = (vm->compiler).token.start;
        uVar12 = (vm->compiler).token.line;
        uVar13 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
        (vm->compiler).previous.length = (vm->compiler).token.length;
        (vm->compiler).previous.line = uVar12;
        *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar13;
        pTVar2->type = TVar6;
        *(undefined4 *)&pTVar2->field_0x4 = uVar14;
        (vm->compiler).previous.start = pcVar18;
        uVar13 = *(undefined4 *)&pTVar3->field_0x4;
        pcVar18 = (vm->compiler).next.start;
        sVar11 = (vm->compiler).next.length;
        uVar12 = (vm->compiler).next.line;
        uVar14 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
        (pCVar1->token).type = pTVar3->type;
        *(undefined4 *)&(pCVar1->token).field_0x4 = uVar13;
        (vm->compiler).token.start = pcVar18;
        (vm->compiler).token.length = sVar11;
        (vm->compiler).token.line = uVar12;
        *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar14;
        scan_token(&local_50,pSVar4);
        (vm->compiler).next.length = local_50.length;
        (vm->compiler).next.line = local_50.line;
        *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
        pTVar3->type = local_50.type;
        *(undefined4 *)&pTVar3->field_0x4 = local_50._4_4_;
        (vm->compiler).next.start = local_50.start;
      }
    }
    write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,'1');
  }
  else {
    if (TVar6 != TOKEN_EOF) goto LAB_0010492c;
    (vm->compiler).print_expr = false;
  }
  return;
}

Assistant:

static void stmt(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_WHILE:
            vm->compiler.print_expr = false;
            while_stmt(vm);
            break;
        case TOKEN_FOR:
            vm->compiler.print_expr = false;
            for_stmt(vm);
            break;
        case TOKEN_RETURN:
            if (vm->frame_count <= 1) {
                error(&vm->compiler, "Cannot return from global scope");
            }

            vm->compiler.print_expr = false;
            advance(vm);

            if (!check(vm, TOKEN_SEMICOLON)) {
                expr(vm);
                consume_optional(vm, TOKEN_SEMICOLON);
            } else {
                advance(vm);
                emit_no_arg(vm, OP_NIL);
            }

            emit_no_arg(vm, OP_RETURN);
            break;
        case TOKEN_EOF:
            vm->compiler.print_expr = false;
            break;
        default:
            simple_stmt(vm);
            break;
    }
}